

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToastOverlay.cpp
# Opt level: O2

void cursespp::ToastOverlay::Show(string *text,int durationMs)

{
  ToastOverlay *this;
  OverlayStack *this_00;
  shared_ptr<cursespp::ToastOverlay> overlay;
  __shared_ptr<cursespp::ToastOverlay,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  __shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this = (ToastOverlay *)operator_new(0x2c8);
  ToastOverlay(this,text,(long)durationMs);
  std::__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ToastOverlay,void>
            ((__shared_ptr<cursespp::ToastOverlay,(__gnu_cxx::_Lock_policy)2> *)&_Stack_38,this);
  this_00 = App::Overlays();
  std::__shared_ptr<cursespp::ILayout,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ToastOverlay,void>(local_28,&_Stack_38);
  OverlayStack::Push(this_00,(ILayoutPtr *)local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

void ToastOverlay::Show(const std::string& text, int durationMs) {
    std::shared_ptr<ToastOverlay> overlay(new ToastOverlay(text, durationMs));
    App::Overlays().Push(overlay);
}